

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

bool QMetaObject::invokeMethod
               (QObject *obj,char *member,ConnectionType type,QGenericReturnArgument ret,
               QGenericArgument val0,QGenericArgument val1,QGenericArgument val2,
               QGenericArgument val3,QGenericArgument val4,QGenericArgument val5,
               QGenericArgument val6,QGenericArgument val7,QGenericArgument val8,
               QGenericArgument val9)

{
  char *member_00;
  QMetaTypeInterface **metaTypes;
  size_t sVar1;
  long in_RDI;
  long in_FS_OFFSET;
  int paramCount;
  void *parameters [11];
  char *typeNames [11];
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  QGenericArgument *this;
  QGenericArgument *this_00;
  QGenericArgument *this_01;
  QGenericArgument *this_02;
  ConnectionType type_00;
  QObject *obj_00;
  int local_f8;
  bool local_d9;
  QGenericArgument local_d8 [16];
  void *local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  long local_8;
  
  this = (QGenericArgument *)&stack0x00000058;
  this_00 = (QGenericArgument *)&stack0x00000048;
  this_01 = (QGenericArgument *)&stack0x00000038;
  this_02 = (QGenericArgument *)&stack0x00000028;
  obj_00 = (QObject *)&stack0x00000018;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    local_d9 = false;
  }
  else {
    memset(&local_68,0xaa,0x58);
    local_68 = QGenericArgument::name(local_d8);
    local_60 = QGenericArgument::name((QGenericArgument *)&stack0x00000008);
    local_58 = QGenericArgument::name((QGenericArgument *)obj_00);
    local_50 = QGenericArgument::name(this_02);
    local_48 = QGenericArgument::name(this_01);
    local_40 = QGenericArgument::name(this_00);
    local_38 = QGenericArgument::name(this);
    local_30 = QGenericArgument::name((QGenericArgument *)&member);
    local_28 = QGenericArgument::name((QGenericArgument *)&stack0x00000078);
    local_20 = QGenericArgument::name((QGenericArgument *)&stack0x00000088);
    local_18 = QGenericArgument::name((QGenericArgument *)(parameters + 1));
    memset(&local_c8,0xaa,0x58);
    local_c8 = QGenericArgument::data(local_d8);
    local_c0 = QGenericArgument::data((QGenericArgument *)&stack0x00000008);
    local_b8 = QGenericArgument::data((QGenericArgument *)obj_00);
    local_b0 = QGenericArgument::data(this_02);
    member_00 = (char *)QGenericArgument::data(this_01);
    QGenericArgument::data(this_00);
    QGenericArgument::data(this);
    metaTypes = (QMetaTypeInterface **)QGenericArgument::data((QGenericArgument *)&member);
    QGenericArgument::data((QGenericArgument *)&stack0x00000078);
    QGenericArgument::data((QGenericArgument *)&stack0x00000088);
    QGenericArgument::data((QGenericArgument *)(parameters + 1));
    for (local_f8 = 1; type_00 = (ConnectionType)((ulong)this_02 >> 0x20), local_f8 < 0xb;
        local_f8 = local_f8 + 1) {
      sVar1 = qstrlen((char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      type_00 = (ConnectionType)((ulong)this_02 >> 0x20);
      if (sVar1 == 0) break;
    }
    local_d9 = invokeMethodImpl(obj_00,member_00,type_00,(qsizetype)this_01,(void **)this_00,
                                (char **)this,metaTypes);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_d9;
}

Assistant:

bool QMetaObject::invokeMethod(QObject *obj,
                               const char *member,
                               Qt::ConnectionType type,
                               QGenericReturnArgument ret,
                               QGenericArgument val0,
                               QGenericArgument val1,
                               QGenericArgument val2,
                               QGenericArgument val3,
                               QGenericArgument val4,
                               QGenericArgument val5,
                               QGenericArgument val6,
                               QGenericArgument val7,
                               QGenericArgument val8,
                               QGenericArgument val9)
{
    if (!obj)
        return false;

    const char *typeNames[] = {ret.name(), val0.name(), val1.name(), val2.name(), val3.name(),
                               val4.name(), val5.name(), val6.name(), val7.name(), val8.name(),
                               val9.name()};
    const void *parameters[] = {ret.data(), val0.data(), val1.data(), val2.data(), val3.data(),
                                val4.data(), val5.data(), val6.data(), val7.data(), val8.data(),
                                val9.data()};
    int paramCount;
    for (paramCount = 1; paramCount < MaximumParamCount; ++paramCount) {
        if (qstrlen(typeNames[paramCount]) <= 0)
            break;
    }
    return invokeMethodImpl(obj, member, type, paramCount, parameters, typeNames, nullptr);
}